

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMap(MapFieldBase *this)

{
  State SVar1;
  void *pvVar2;
  long *in_RDI;
  size_t n;
  Arena **in_stack_ffffffffffffff48;
  type_info *ptr;
  type_info *allocated_type;
  Arena *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  ArenaImpl *in_stack_ffffffffffffff70;
  RepeatedPtrField<google::protobuf::Message> *local_38;
  
  SVar1 = std::atomic<google::protobuf::internal::MapFieldBase::State>::load
                    ((atomic<google::protobuf::internal::MapFieldBase::State> *)(in_RDI + 8),
                     memory_order_acquire);
  if (SVar1 == STATE_MODIFIED_MAP) {
    WrappedMutex::Lock((WrappedMutex *)0x4283cc);
    SVar1 = std::atomic<google::protobuf::internal::MapFieldBase::State>::load
                      ((atomic<google::protobuf::internal::MapFieldBase::State> *)(in_RDI + 8),
                       memory_order_relaxed);
    if (SVar1 == STATE_MODIFIED_MAP) {
      (**(code **)(*in_RDI + 0x68))();
      std::atomic<google::protobuf::internal::MapFieldBase::State>::store
                ((atomic<google::protobuf::internal::MapFieldBase::State> *)(in_RDI + 8),CLEAN,
                 memory_order_release);
    }
    WrappedMutex::Unlock((WrappedMutex *)0x428412);
  }
  else if (SVar1 == CLEAN) {
    WrappedMutex::Lock((WrappedMutex *)0x428425);
    SVar1 = std::atomic<google::protobuf::internal::MapFieldBase::State>::load
                      ((atomic<google::protobuf::internal::MapFieldBase::State> *)(in_RDI + 8),
                       memory_order_relaxed);
    if (SVar1 == CLEAN) {
      if (in_RDI[2] == 0) {
        if (in_RDI[1] == 0) {
          pvVar2 = operator_new(0x18);
          RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                    ((RepeatedPtrField<google::protobuf::Message> *)0x428474);
          in_RDI[2] = (long)pvVar2;
        }
        else {
          ptr = (type_info *)in_RDI[1];
          if (ptr == (type_info *)0x0) {
            local_38 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
            RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)0x4284f4);
          }
          else {
            allocated_type = ptr;
            AlignUpTo8(0x18);
            Arena::AllocHook(in_stack_ffffffffffffff60,allocated_type,(size_t)ptr);
            ArenaImpl::AllocateAlignedAndAddCleanup
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (_func_void_void_ptr *)in_stack_ffffffffffffff60);
            local_38 = Arena::
                       InternalHelper<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                       ::Construct<google::protobuf::Arena*>(ptr,in_stack_ffffffffffffff48);
          }
          in_RDI[2] = (long)local_38;
        }
      }
      std::atomic<google::protobuf::internal::MapFieldBase::State>::store
                ((atomic<google::protobuf::internal::MapFieldBase::State> *)(in_RDI + 8),CLEAN,
                 memory_order_release);
    }
    WrappedMutex::Unlock((WrappedMutex *)0x42863b);
  }
  return;
}

Assistant:

void MapFieldBase::SyncRepeatedFieldWithMap() const {
  // acquire here matches with release below to ensure that we can only see a
  // value of CLEAN after all previous changes have been synced.
  switch (state_.load(std::memory_order_acquire)) {
    case STATE_MODIFIED_MAP:
      mutex_.Lock();
      // Double check state, because another thread may have seen the same
      // state and done the synchronization before the current thread.
      if (state_.load(std::memory_order_relaxed) == STATE_MODIFIED_MAP) {
        SyncRepeatedFieldWithMapNoLock();
        state_.store(CLEAN, std::memory_order_release);
      }
      mutex_.Unlock();
      break;
    case CLEAN:
      mutex_.Lock();
      // Double check state
      if (state_.load(std::memory_order_relaxed) == CLEAN) {
        if (repeated_field_ == nullptr) {
          if (arena_ == nullptr) {
            repeated_field_ = new RepeatedPtrField<Message>();
          } else {
            repeated_field_ =
                Arena::CreateMessage<RepeatedPtrField<Message> >(arena_);
          }
        }
        state_.store(CLEAN, std::memory_order_release);
      }
      mutex_.Unlock();
      break;
    default:
      break;
  }
}